

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcx.c
# Opt level: O3

image_data * pcx_read(sptr_t data)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint8_t uVar8;
  uint16_t uVar9;
  image_data *piVar10;
  uint8_t *puVar11;
  ulong uVar12;
  size_t size;
  bool bVar13;
  sptr_t sVar14;
  sptr_t sVar15;
  uchar *ptr;
  uchar *local_38;
  
  piVar10 = (image_data *)xmalloc(0x50);
  local_38 = data.ptr;
  puVar11 = (uint8_t *)xmalloc(0x80);
  uVar8 = read_8(&local_38);
  *puVar11 = uVar8;
  uVar8 = read_8(&local_38);
  puVar11[1] = uVar8;
  uVar8 = read_8(&local_38);
  puVar11[2] = uVar8;
  uVar8 = read_8(&local_38);
  puVar11[3] = uVar8;
  uVar9 = read_le16(&local_38);
  *(uint16_t *)(puVar11 + 4) = uVar9;
  uVar9 = read_le16(&local_38);
  *(uint16_t *)(puVar11 + 6) = uVar9;
  uVar9 = read_le16(&local_38);
  *(uint16_t *)(puVar11 + 8) = uVar9;
  uVar9 = read_le16(&local_38);
  *(uint16_t *)(puVar11 + 10) = uVar9;
  uVar9 = read_le16(&local_38);
  *(uint16_t *)(puVar11 + 0xc) = uVar9;
  uVar9 = read_le16(&local_38);
  *(uint16_t *)(puVar11 + 0xe) = uVar9;
  uVar3 = *(undefined8 *)(local_38 + 8);
  uVar4 = *(undefined8 *)(local_38 + 0x10);
  uVar5 = *(undefined8 *)(local_38 + 0x18);
  uVar6 = *(undefined8 *)(local_38 + 0x20);
  uVar7 = *(undefined8 *)(local_38 + 0x28);
  *(undefined8 *)(puVar11 + 0x10) = *(undefined8 *)local_38;
  *(undefined8 *)(puVar11 + 0x18) = uVar3;
  *(undefined8 *)(puVar11 + 0x20) = uVar4;
  *(undefined8 *)(puVar11 + 0x28) = uVar5;
  *(undefined8 *)(puVar11 + 0x30) = uVar6;
  *(undefined8 *)(puVar11 + 0x38) = uVar7;
  local_38 = local_38 + 0x30;
  uVar8 = read_8(&local_38);
  puVar11[0x40] = uVar8;
  uVar8 = read_8(&local_38);
  puVar11[0x41] = uVar8;
  uVar9 = read_le16(&local_38);
  *(uint16_t *)(puVar11 + 0x42) = uVar9;
  uVar9 = read_le16(&local_38);
  *(uint16_t *)(puVar11 + 0x44) = uVar9;
  uVar9 = read_le16(&local_38);
  *(uint16_t *)(puVar11 + 0x46) = uVar9;
  uVar9 = read_le16(&local_38);
  *(uint16_t *)(puVar11 + 0x48) = uVar9;
  uVar3 = *(undefined8 *)(local_38 + 8);
  uVar4 = *(undefined8 *)(local_38 + 0x10);
  uVar5 = *(undefined8 *)(local_38 + 0x18);
  uVar6 = *(undefined8 *)(local_38 + 0x20);
  uVar7 = *(undefined8 *)(local_38 + 0x28);
  *(undefined8 *)(puVar11 + 0x4a) = *(undefined8 *)local_38;
  *(undefined8 *)(puVar11 + 0x52) = uVar3;
  *(undefined8 *)(puVar11 + 0x5a) = uVar4;
  *(undefined8 *)(puVar11 + 0x62) = uVar5;
  *(undefined8 *)(puVar11 + 0x6a) = uVar6;
  *(undefined8 *)(puVar11 + 0x72) = uVar7;
  *(undefined8 *)(puVar11 + 0x78) = *(undefined8 *)(local_38 + 0x2e);
  sVar14 = sptr_advance(data,0x80);
  uVar12 = sVar14.size;
  piVar10->type = '\x04';
  piVar10->header = puVar11;
  bVar13 = true;
  if (0x300 < uVar12) {
    bVar13 = puVar11[3] != '\b';
  }
  uVar1 = *(uint *)(puVar11 + 8);
  uVar2 = *(uint *)(puVar11 + 4);
  piVar10->width = (uVar1 & 0xffff) - (uVar2 & 0xffff);
  piVar10->height = (uVar1 >> 0x10) - (uVar2 >> 0x10);
  size = uVar12 - 0x300;
  if (bVar13) {
    size = uVar12;
  }
  sVar15 = sptr_xmalloc(size);
  piVar10->pixels = sVar15;
  memcpy(sVar15.ptr,sVar14.ptr,sVar15.size);
  sVar14 = sptr_advance(sVar14,(piVar10->pixels).size);
  if (bVar13) {
    (piVar10->palette).data.ptr = (uchar *)0x0;
    (piVar10->palette).data.size = 0;
    (piVar10->palette).type = '\0';
  }
  else {
    sVar15 = sptr_xmalloc(0x300);
    (piVar10->palette).data = sVar15;
    (piVar10->palette).type = '\x01';
    memcpy(sVar15.ptr,sVar14.ptr,0x300);
  }
  return piVar10;
}

Assistant:

struct image_data *pcx_read(const sptr_t data)
{
	unsigned char has_palette = 0;
	struct image_data *im = xmalloc(sizeof(struct image_data));
	struct pcx_header *header = read_header(data);
	sptr_t content = sptr_advance(data, PCX_HEADER_SIZE);
	im->type = IMAGE_TYPE_PCX;
	im->header = header;
	if (content.size > 768) {
		has_palette = header->bpp == 8;
	}
	im->width = header->xmax - header->xmin;
	im->height = header->ymax - header->ymin;
	im->pixels = has_palette ? sptr_xmalloc(content.size - PCX_PALETTE_SIZE)
							 : sptr_xmalloc(content.size);
	memcpy(im->pixels.ptr, content.ptr, im->pixels.size);
	content = sptr_advance(content, im->pixels.size);
	if (has_palette) {
		im->palette = (struct image_palette){sptr_xmalloc(PCX_PALETTE_SIZE),
											 PALETTE_TYPE_RGB_256};
		memcpy(im->palette.data.ptr, content.ptr, PCX_PALETTE_SIZE);
	} else {
		im->palette = (struct image_palette){SPTR_NULL, PALETTE_TYPE_NONE};
	}
	return im;
}